

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statzone.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  __ssize_t _Var3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  bool bVar9;
  char *linebuffer;
  string domain;
  string previous_domain;
  size_t linesize;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_ns;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signed_domains;
  FILE *local_120;
  byte *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 local_100 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_f0 [2];
  undefined1 local_e0 [16];
  __node_base local_d0;
  char *local_c8;
  _Hash_node_base local_c0 [2];
  __node_base_ptr local_b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_118 = (byte *)0x0;
  local_b0 = (__node_base_ptr)0x0;
  local_110 = local_100;
  local_108 = (char *)0x0;
  local_100[0] = 0;
  local_d0._M_nxt = local_c0;
  local_c8 = (char *)0x0;
  local_c0[0]._M_nxt._0_1_ = 0;
LAB_00102480:
  iVar1 = getopt(argc,argv,"hv");
  if (iVar1 != -1) {
    if (iVar1 != 0x76) goto code_r0x00102497;
    pcVar8 = "StatZone 1.1.2";
    goto LAB_00102518;
  }
  if (_optind < argc) {
    pcVar8 = argv[_optind];
    begin.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    iVar1 = strcmp(pcVar8,"-");
    if (iVar1 == 0) {
      local_120 = _stdin;
    }
    else {
      local_120 = fopen(pcVar8,"r");
      if (local_120 == (FILE *)0x0) {
        perror("Can\'t open zone file");
        iVar1 = 1;
        goto LAB_0010251f;
      }
    }
    while (_Var3 = getline((char **)&local_118,(size_t *)&local_b0,local_120), _Var3 != -1) {
      if ((0x3b < (ulong)*local_118) ||
         ((0x800001000000001U >> ((ulong)*local_118 & 0x3f) & 1) == 0)) {
        pcVar8 = strtok((char *)local_118," \t");
        if (pcVar8 != (char *)0x0) {
          pcVar4 = strtolower(pcVar8);
          pcVar5 = local_108;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)&local_110,0,pcVar5,(ulong)pcVar4);
          iVar1 = 0;
          while (*pcVar8 != ';') {
            pcVar8 = strtolower(pcVar8);
            bVar9 = iVar1 != 0;
            iVar1 = iVar1 + -1;
            if (bVar9) {
              iVar2 = strcmp(pcVar8,"nsec");
              if (((iVar2 == 0) || (iVar2 = strcmp(pcVar8,"nsec3"), iVar2 == 0)) ||
                 (iVar2 = strcmp(pcVar8,"rrsig"), iVar2 == 0)) break;
              iVar2 = strcmp(pcVar8,"a");
              if (iVar2 == 0) {
                results.a = results.a + 1;
              }
              iVar2 = strcmp(pcVar8,"aaaa");
              if (iVar2 == 0) {
                results.aaaa = results.aaaa + 1;
              }
              iVar2 = strcmp(pcVar8,"ds");
              if (iVar2 == 0) {
                results.ds = results.ds + 1;
                local_f0[0] = &local_68;
                std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_f0[0],&local_110,local_f0);
              }
            }
            iVar2 = strcmp(pcVar8,"ns");
            pcVar5 = local_c8;
            pcVar8 = local_108;
            if (iVar2 == 0) {
              results.ns = results.ns + 1;
              pcVar4 = local_108;
              if (local_c8 < local_108) {
                pcVar4 = local_c8;
              }
              if (pcVar4 == (char *)0x0) {
                bVar9 = true;
              }
              else {
                iVar2 = bcmp(local_110,local_d0._M_nxt,(size_t)pcVar4);
                bVar9 = iVar2 == 0;
              }
              if (!(bool)(bVar9 & pcVar8 == pcVar5)) {
                results.domains = results.domains + 1;
                std::__cxx11::string::_M_assign((string *)&local_d0);
                iVar2 = std::__cxx11::string::compare((ulong)&local_110,0,(char *)0x4);
                if (iVar2 == 0) {
                  results.idn = results.idn + 1;
                }
              }
              pcVar5 = strtok((char *)0x0,"\n");
              pcVar8 = (char *)0x0;
              if ((pcVar5 != (char *)0x0) &&
                 (pcVar4 = strchr(pcVar5,0x20), pcVar8 = pcVar5, pcVar4 != (char *)0x0)) {
                pcVar8 = strtok((char *)0x0,"\n");
              }
              if (pcVar8 != (char *)0x0) {
                local_f0[0] = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_e0;
                sVar6 = strlen(pcVar8);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f0,pcVar8,pcVar8 + sVar6);
                local_a8 = &local_a0;
                std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_a8,(string *)local_f0,&local_a8);
                if (local_f0[0] !=
                    (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_e0) {
                  operator_delete(local_f0[0]);
                }
              }
            }
            pcVar8 = strtok((char *)0x0," \t");
            if (pcVar8 == (char *)0x0) break;
          }
        }
        results.processedLines = results.processedLines + 1;
      }
    }
    if (results.domains != 0) {
      results.domains = results.domains - 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---[ CSV values ]--------------------------------------------------------------",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    current.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Processed ",10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," lines in ",10);
    std::ostream::_M_insert<double>
              ((double)(((long)current.__d.__r - (long)begin.__d.__r) / 1000) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    free(local_118);
    fclose(local_120);
    goto LAB_0010251d;
  }
  goto LAB_00102508;
code_r0x00102497:
  if (iVar1 == 0x68) {
LAB_00102508:
    pcVar8 = 
    "statzone [-hv] zonefile\n\nThe options are as follows:\n\n\t-h\tDisplay usage.\n\t-v\tDisplay version."
    ;
LAB_00102518:
    puts(pcVar8);
LAB_0010251d:
    iVar1 = 0;
LAB_0010251f:
    if (local_d0._M_nxt != local_c0) {
      operator_delete(local_d0._M_nxt);
    }
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    return iVar1;
  }
  goto LAB_00102480;
}

Assistant:

int
main(int argc, char *argv[])
{
	std::unordered_set<std::string> signed_domains;
	std::unordered_set<std::string> unique_ns;

	int opt, token_count;

	char *linebuffer = NULL;
	size_t linesize = 0;

	char *input;
	std::string domain, previous_domain;
	char *rdata, *token = nullptr, *token_lc = nullptr;

	FILE *zonefile;

#ifdef HAVE_SECCOMP
	if (prctl(PR_SET_NO_NEW_PRIVS, 1, 0, 0, 0)) {
		perror("Can't initialize seccomp");
		return EXIT_FAILURE;
	}

	if (prctl(PR_SET_SECCOMP, SECCOMP_MODE_FILTER, &statzone)) {
		perror("Can't load seccomp filter");
		return EXIT_FAILURE;
	}
#endif

#ifdef SIGINFO
	signal(SIGINFO, siginfo_handler);
#endif

	while ((opt = getopt(argc, argv, "hv")) != -1) {
		switch (opt) {

		case 'h':
			usage();
			return EXIT_SUCCESS;

		case 'v':
			printf("%s\n", VERSION);
			return EXIT_SUCCESS;
		}
	}

	if (optind < argc) {
		input = argv[optind];
	} else {
		usage();
		return EXIT_SUCCESS;
	}

	/* Starting timer */
	begin = std::chrono::steady_clock::now();

	/* Open zone file */
	if (!strcmp(input, "-")) {
		/* Read from standard input */
		zonefile = stdin;
	} else {
		/* Attempt to read from file */
		if (!(zonefile = fopen(input, "r"))) {
			perror("Can't open zone file");
			return EXIT_FAILURE;
		}
	}

	while (getline(&linebuffer, &linesize, zonefile) != -1) {
		if (!*linebuffer)
			continue;

		if (*linebuffer == ';') /* Comments */
			continue;

		if (*linebuffer == '$') /* Directives */
			continue;

		token_count = 0;
		token = strtok(linebuffer, " \t");

		if (token)
			domain = strtolower(token);

		while (token) {
			if (*token == ';') { /* Comments */
				token = nullptr;
				continue;
			}

			token_lc = strtolower(token);
			if (token_count && !strcmp(token_lc, "nsec")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "nsec3")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "rrsig")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "a"))
				results.a++;

			if (token_count && !strcmp(token_lc, "aaaa"))
				results.aaaa++;

			if (token_count && !strcmp(token_lc, "ds")) {
				results.ds++;

				signed_domains.insert(domain);
			}

			if (!strcmp(token_lc, "ns")) {
				results.ns++;

				if (domain.compare(previous_domain)) {
					results.domains++;

					previous_domain = domain;

					if (!domain.compare(0, 4, "xn--"))
						results.idn++;
				}

				rdata = strtok(nullptr, "\n");

				if (rdata && strchr(rdata, ' '))
					rdata = strtok(nullptr, "\n");

				if (rdata)
					unique_ns.insert(rdata);
			}

			token = strtok(nullptr, " \t");
			token_count++;
		}

		results.processedLines++;
	}

	/* Don't count origin */
	if (results.domains)
		results.domains--;

	/* Printing CVS values */
	std::cout << "---[ CSV values ]--------------------------------------------------------------" << std::endl;
	std::cout << "IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains" << std::endl;
	std::cout << results.a << ",";
	std::cout << results.aaaa << ",";
	std::cout << results.ns << ",";
	std::cout << unique_ns.size() << ",";
	std::cout << results.ds << ",";
	std::cout << signed_domains.size() << ",";
	std::cout << results.idn << ",";
	std::cout << results.domains << std::endl;

	/* Printing results */
	summary();

	/* Clean up */
	free(linebuffer);
	fclose(zonefile);

	return EXIT_SUCCESS;
}